

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O1

bool (anonymous_namespace)::
     have_same_elements<boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>,int>
               (priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *values
               ,multiset<int,_std::less<int>,_std::allocator<int>_> *rf)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  const_iterator __position;
  int *piVar4;
  bool bVar5;
  
  piVar4 = (values->sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = piVar4 == (values->sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  if (!bVar5) {
    p_Var1 = &(rf->_M_t)._M_impl.super__Rb_tree_header;
    do {
      p_Var3 = (rf->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var2 = &p_Var1->_M_header;
      if (p_Var3 != (_Base_ptr)0x0) {
        do {
          if (*piVar4 <= (int)*(size_t *)(p_Var3 + 1)) {
            p_Var2 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < *piVar4];
        } while (p_Var3 != (_Base_ptr)0x0);
      }
      __position._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
         (__position._M_node = p_Var2, *piVar4 < (int)p_Var2[1]._M_color)) {
        __position._M_node = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)__position._M_node == p_Var1) {
        if (!bVar5) {
          return false;
        }
        break;
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       rf,__position);
      piVar4 = piVar4 + 1;
      bVar5 = piVar4 == (values->sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
    } while (!bVar5);
  }
  return (rf->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0;
}

Assistant:

bool have_same_elements(T const & values, std::multiset<T2> rf)
{
  typedef typename T::const_iterator itr_t;
  for (itr_t it = values.begin(); it != values.end(); ++it)
  {
    typedef typename std::multiset<T2>::iterator set_itr_t;
    set_itr_t set_it = rf.find(*it);
    if (set_it == rf.end())
      return false;
    else
      rf.erase(set_it);
  }
  return rf.empty();
}